

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

global_object_create_result *
mjs::make_error_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  size_t sVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  long *plVar5;
  void *pvVar6;
  char *pcVar7;
  function_object *pfVar8;
  long *plVar9;
  int *piVar10;
  long lVar11;
  gc_heap_ptr<mjs::gc_function> p;
  object_ptr prototype;
  native_error_type error_type;
  string n;
  gc_heap_ptr<mjs::function_object> constructor;
  object_ptr error_prototype;
  gc_heap_ptr<mjs::function_object> error_constructor;
  string err_str;
  undefined1 local_140 [16];
  gc_heap_ptr_untyped local_130;
  string_view local_120;
  undefined1 local_10c [12];
  undefined1 local_100 [24];
  gc_heap_ptr_untyped local_e8;
  gc_heap_ptr_untyped local_d8;
  string_view local_c8;
  gc_heap_ptr_untyped local_b8;
  string_view local_a8;
  gc_heap_ptr_untyped local_98;
  undefined1 local_88 [16];
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [40];
  gc_heap_ptr_untyped local_40;
  
  local_68._16_8_ = __return_storage_ptr__;
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x98))(local_68 + 0x18,plVar5,"Error");
  pvVar6 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  sVar1 = *(size_t *)((long)pvVar6 + 8);
  local_130.heap_ = (gc_heap *)((ulong)local_130.heap_._4_4_ << 0x20);
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x58))(local_140,plVar5);
  local_10c._4_8_ = global;
  pvVar6 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_c8._M_len = 0;
  local_c8._M_str = "";
  string::string((string *)&local_120,*(gc_heap **)((long)pvVar6 + 8),&local_c8);
  gc_heap::
  allocate_and_construct<mjs::error_object,mjs::native_error_type,mjs::string&,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)local_100,sVar1,(native_error_type *)0x38,(string *)(local_140 + 0x10),
             (gc_heap_ptr<mjs::object> *)(local_68 + 0x18),(string *)local_140);
  local_98.heap_ = (gc_heap *)local_100._0_8_;
  local_98.pos_ = local_100._8_4_;
  if ((slot *)local_100._0_8_ != (slot *)0x0) {
    gc_heap::attach((gc_heap *)local_100._0_8_,&local_98);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
  local_78.heap_ = (gc_heap *)0x0;
  local_78.pos_ = 0;
  lVar11 = 0;
  do {
    local_10c._0_4_ = *(native_error_type *)((long)&native_error_types + lVar11);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
    pcVar7 = type_string(local_10c._0_4_);
    (**(code **)(*plVar5 + 0x98))(&local_c8,plVar5,pcVar7);
    uVar3 = local_10c._4_8_;
    uVar2 = local_10c._0_4_;
    if (local_10c._0_4_ == generic) {
      local_130.heap_ = local_98.heap_;
      local_130.pos_ = local_98.pos_;
      if ((slot *)local_98.heap_ != (slot *)0x0) {
        gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_140 + 0x10));
      }
    }
    else {
      pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
      sVar1 = *(size_t *)((long)pvVar6 + 8);
      pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)uVar3);
      local_100._0_8_ = (slot *)0x0;
      local_100._8_8_ = (long)"\t" + 1;
      string::string((string *)&local_40,*(gc_heap **)((long)pvVar6 + 8),(string_view *)local_100);
      gc_heap::
      allocate_and_construct<mjs::error_object,mjs::native_error_type_const&,mjs::string&,mjs::gc_heap_ptr<mjs::object>&,mjs::string>
                ((gc_heap *)local_68,sVar1,(native_error_type *)0x38,(string *)local_10c,
                 (gc_heap_ptr<mjs::object> *)&local_c8,(string *)&local_98);
      local_130.heap_ = (gc_heap *)local_68._0_8_;
      local_130.pos_ = local_68._8_4_;
      if ((slot *)local_68._0_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_68._0_8_,(gc_heap_ptr_untyped *)(local_140 + 0x10));
      }
    }
    if (uVar2 != generic) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
    }
    uVar3 = local_10c._4_8_;
    local_100._0_4_ = local_10c._0_4_;
    local_100._8_8_ = local_c8._M_len;
    local_100._16_4_ = (uint32_t)local_c8._M_str;
    if ((gc_heap *)local_c8._M_len != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_100 + 8));
    }
    local_e8.heap_ = local_130.heap_;
    local_e8.pos_ = local_130.pos_;
    if ((slot *)local_130.heap_ != (slot *)0x0) {
      gc_heap::attach(local_130.heap_,&local_e8);
    }
    local_d8.heap_ = (gc_heap *)*(slot **)uVar3;
    local_d8.pos_ = *(uint32_t *)(uVar3 + 8);
    if ((slot *)local_d8.heap_ != (slot *)0x0) {
      gc_heap::attach(local_d8.heap_,&local_d8);
    }
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_140 + 0x10));
    object::class_name((object *)local_88);
    make_raw_function((mjs *)&local_b8,(gc_heap_ptr<mjs::global_object> *)uVar3);
    pfVar8 = (function_object *)gc_heap_ptr_untyped::get(&local_b8);
    local_120._M_len = 0;
    local_120._M_str = (char *)((ulong)local_120._M_str & 0xffffffff00000000);
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_140,(size_t)(pfVar8->super_native_object).super_object.heap_);
    pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_140);
    *(undefined ***)((long)pvVar6 + 8) = &PTR_destroy_001d39d8;
    *(undefined4 *)((long)pvVar6 + 0x10) = local_100._0_4_;
    *(undefined8 *)((long)pvVar6 + 0x18) = local_100._8_8_;
    *(undefined4 *)((long)pvVar6 + 0x20) = local_100._16_4_;
    if ((gc_heap *)local_100._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_100._8_8_,(gc_heap_ptr_untyped *)((long)pvVar6 + 0x18));
    }
    *(gc_heap **)((long)pvVar6 + 0x28) = local_e8.heap_;
    *(uint32_t *)((long)pvVar6 + 0x30) = local_e8.pos_;
    if ((slot *)local_e8.heap_ != (slot *)0x0) {
      gc_heap::attach(local_e8.heap_,(gc_heap_ptr_untyped *)((long)pvVar6 + 0x28));
    }
    *(gc_heap **)((long)pvVar6 + 0x38) = local_d8.heap_;
    *(uint32_t *)((long)pvVar6 + 0x40) = local_d8.pos_;
    if ((slot *)local_d8.heap_ != (slot *)0x0) {
      gc_heap::attach(local_d8.heap_,(gc_heap_ptr_untyped *)((long)pvVar6 + 0x38));
    }
    function_object::put_function
              (pfVar8,(gc_heap_ptr<mjs::gc_function> *)local_140,
               (gc_heap_ptr<mjs::gc_string> *)local_88,(gc_heap_ptr<mjs::gc_string> *)&local_120,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_100 + 8));
    pfVar8 = (function_object *)gc_heap_ptr_untyped::get(&local_b8);
    function_object::default_construct_function(pfVar8);
    pfVar8 = (function_object *)gc_heap_ptr_untyped::get(&local_b8);
    function_object::put_prototype_with_attributes
              (pfVar8,(object_ptr *)(local_140 + 0x10),dont_delete|dont_enum|read_only);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_140 + 0x10));
    plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
    (**(code **)(*plVar9 + 0x98))(local_140,plVar9,"constructor");
    local_120._M_len = (size_t)local_b8.heap_;
    local_120._M_str = (char *)CONCAT44(local_120._M_str._4_4_,local_b8.pos_);
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)&local_120);
    }
    local_100._0_4_ = object;
    local_100._8_8_ = local_120._M_len;
    local_100._16_4_ = (uint32_t)local_120._M_str;
    if ((gc_heap *)local_120._M_len != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._M_len,(gc_heap_ptr_untyped *)(local_100 + 8));
    }
    (**(code **)(*plVar5 + 0x28))(plVar5,local_140,(value *)local_100,2);
    value::destroy((value *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_140 + 0x10));
    pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
    local_120._M_len = 7;
    local_120._M_str = "message";
    string::string((string *)local_140,*(gc_heap **)((long)pvVar6 + 8),&local_120);
    pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
    local_a8._M_len = 0;
    local_a8._M_str = "";
    string::string((string *)local_88,*(gc_heap **)((long)pvVar6 + 8),&local_a8);
    local_100._0_4_ = 4;
    local_100._8_8_ = local_88._0_8_;
    local_100._16_4_ = local_88._8_4_;
    if ((gc_heap *)local_88._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_88._0_8_,(gc_heap_ptr_untyped *)(local_100 + 8));
    }
    (**(code **)(*plVar5 + 8))(plVar5,local_140,(value *)local_100,6);
    value::destroy((value *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_88);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    if (local_78.heap_ == (gc_heap *)0x0) {
      piVar10 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_c8);
      if (*piVar10 != 5) {
LAB_00135b63:
        __assert_fail("n.view() == L\"Error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp"
                      ,0x7c,
                      "global_object_create_result mjs::make_error_object(const gc_heap_ptr<global_object> &)"
                     );
      }
      iVar4 = wmemcmp(piVar10 + 1,L"Error",5);
      if (iVar4 != 0) goto LAB_00135b63;
      gc_heap_ptr_untyped::operator=(&local_78,&local_b8);
    }
    else {
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_10c._4_8_);
      local_140._0_8_ = local_b8.heap_;
      local_140._8_4_ = local_b8.pos_;
      if (local_b8.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)local_140);
      }
      local_100._0_4_ = 5;
      local_100._8_8_ = local_140._0_8_;
      local_100._16_4_ = local_140._8_4_;
      if ((gc_heap *)local_140._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_140._0_8_,(gc_heap_ptr_untyped *)(local_100 + 8));
      }
      (**(code **)(*plVar5 + 8))(plVar5,&local_c8,(value *)local_100,2);
      value::destroy((value *)local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_140 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    uVar3 = local_10c._4_8_;
    lVar11 = lVar11 + 4;
    if (lVar11 == 0x20) {
      local_a8._M_len = (size_t)*(slot **)local_10c._4_8_;
      local_a8._M_str = (char *)CONCAT44(local_a8._M_str._4_4_,*(uint32_t *)(local_10c._4_8_ + 8));
      if ((slot *)local_a8._M_len != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_a8._M_len,(gc_heap_ptr_untyped *)&local_a8);
      }
      local_88._0_8_ = (gc_heap *)0x8;
      local_88._8_8_ = "toString";
      string::string((string *)&local_b8,(gc_heap *)&(*(slot **)uVar3)->allocation,
                     (string_view *)local_88);
      plVar5 = (long *)gc_heap_ptr_untyped::get(&local_98);
      make_raw_function((mjs *)(local_140 + 0x10),(gc_heap_ptr<mjs::global_object> *)uVar3);
      pfVar8 = (function_object *)
               gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_140 + 0x10));
      local_120._M_len = 0;
      local_120._M_str = (char *)((ulong)local_120._M_str & 0xffffffff00000000);
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_140,(size_t)(pfVar8->super_native_object).super_object.heap_);
      pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_140);
      *(undefined ***)((long)pvVar6 + 8) = &PTR_destroy_001d3a18;
      *(size_t *)((long)pvVar6 + 0x10) = local_a8._M_len;
      *(undefined4 *)((long)pvVar6 + 0x18) = local_a8._M_str._0_4_;
      if ((slot *)local_a8._M_len != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_a8._M_len,(gc_heap_ptr_untyped *)((long)pvVar6 + 0x10));
      }
      function_object::put_function
                (pfVar8,(gc_heap_ptr<mjs::gc_function> *)local_140,
                 (gc_heap_ptr<mjs::gc_string> *)&local_b8,(gc_heap_ptr<mjs::gc_string> *)&local_120,
                 0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_140);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
      local_c8._M_len = (size_t)local_130.heap_;
      local_c8._M_str = (char *)CONCAT44(local_c8._M_str._4_4_,local_130.pos_);
      if ((slot *)local_130.heap_ != (slot *)0x0) {
        gc_heap::attach(local_130.heap_,(gc_heap_ptr_untyped *)&local_c8);
      }
      local_100._0_4_ = 5;
      local_100._8_8_ = local_c8._M_len;
      local_100._16_4_ = (uint32_t)local_c8._M_str;
      if ((slot *)local_c8._M_len != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_100 + 8));
      }
      (**(code **)(*plVar5 + 8))(plVar5,&local_b8,local_100,2);
      value::destroy((value *)local_100);
      uVar3 = local_68._16_8_;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_140 + 0x10));
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
      *(gc_heap **)uVar3 = local_78.heap_;
      ((slot *)(uVar3 + 8))->new_position = local_78.pos_;
      if (local_78.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_78.heap_,(gc_heap_ptr_untyped *)uVar3);
      }
      ((slot *)(uVar3 + 0x10))->representation = 0;
      ((slot *)(uVar3 + 0x18))->new_position = 0;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_68 + 0x18));
      return (global_object_create_result *)(slot *)uVar3;
    }
  } while( true );
}

Assistant:

global_object_create_result make_error_object(const gc_heap_ptr<global_object>& global) {
    auto err_str = global->common_string("Error");

    object_ptr error_prototype = global->heap().make<error_object>(native_error_type::generic, err_str, global->object_prototype(), string{global->heap(), ""});

    gc_heap_ptr<function_object> error_constructor;
    for (const auto error_type: native_error_types) {
        auto n = global->common_string(type_string(error_type));
        auto prototype = error_type == native_error_type::generic ? error_prototype : global->heap().make<error_object>(error_type, n, error_prototype, string{global->heap(), ""});
        auto constructor = make_function(global, [error_type, n, prototype, global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto eo = h.make<error_object>(error_type, n, prototype, string{h, global->stack_trace()});
            if (!args.empty() && args.front().type() != value_type::undefined) {
                eo->put(global->common_string("message"), value{to_string(h, args.front())}, message_attributes);
            }
            return value{eo};
        }, prototype->class_name().unsafe_raw_get(), 1);
        constructor->default_construct_function();

        constructor->put_prototype_with_attributes(prototype, global_object::prototype_attributes);

        prototype->redefine_own_property(global->common_string("constructor"), value{constructor}, global_object::default_attributes);
        prototype->put(string{global->heap(), "message"}, value{string{global->heap(), ""}}, message_attributes);

        if (!error_constructor) {
            assert(n.view() == L"Error");
            error_constructor = constructor;
        } else {
            global->put(n, value{constructor}, property_attribute::dont_enum);
        }
    }

    put_native_function(global, error_prototype, "toString", [global](const value& this_, const std::vector<value>&) {
        if (this_.type() == value_type::object) {
            auto& o = this_.object_value();
            if (o.has_type<error_object>()) {
                return value{static_cast<const error_object&>(*o).to_string()};
            }
        }
        return value{global->common_string("Error")};
    }, 0);

    return { error_constructor, nullptr };
}